

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O0

bool DoGroupForOne(AActor *victim,AActor *source,AActor *dest,bool floorz,bool fog)

{
  undefined1 auVar1 [8];
  int flags;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_190;
  TAngle<double> local_140;
  TAngle<double> local_138;
  TAngle<double> local_130;
  TAngle<double> local_128;
  TAngle<double> local_120;
  TAngle<double> local_118;
  DVector3 local_110;
  undefined1 local_f8 [32];
  TVector3<double> local_d8;
  byte local_b9;
  double dStack_b8;
  bool res;
  double z;
  DVector2 newp;
  TAngle<double> local_98;
  DAngle offAngle;
  DVector3 local_78;
  TVector3<double> local_60;
  undefined1 local_48 [8];
  DVector2 off;
  TAngle<double> local_30;
  DAngle an;
  bool fog_local;
  bool floorz_local;
  AActor *dest_local;
  AActor *source_local;
  AActor *victim_local;
  
  an.Degrees._6_1_ = fog;
  an.Degrees._7_1_ = floorz;
  TAngle<double>::TAngle((TAngle<double> *)&off.Y,&(source->Angles).Yaw);
  TAngle<double>::operator-(&local_30,&(dest->Angles).Yaw);
  AActor::Pos(&local_78,victim);
  AActor::Pos((DVector3 *)&offAngle,source);
  TVector3<double>::operator-(&local_60,&local_78,(TVector3<double> *)&offAngle);
  TVector2<double>::TVector2((TVector2<double> *)local_48,&local_60);
  TAngle<double>::TAngle((TAngle<double> *)&newp.Y,&(source->Angles).Yaw);
  TAngle<double>::operator-(&local_98,&(victim->Angles).Yaw);
  auVar1 = local_48;
  dVar2 = TAngle<double>::Cos(&local_30);
  dVar6 = off.X;
  dVar3 = TAngle<double>::Sin(&local_30);
  dVar4 = TAngle<double>::Sin(&local_30);
  dVar5 = TAngle<double>::Cos(&local_30);
  TVector2<double>::TVector2
            ((TVector2<double> *)&z,(double)auVar1 * dVar2 - dVar6 * dVar3,
             (double)local_48 * dVar4 + off.X * dVar5);
  if ((an.Degrees._7_1_ & 1) == 0) {
    dVar6 = AActor::Z(dest);
    dVar2 = AActor::Z(victim);
    local_190 = AActor::Z(source);
    local_190 = (dVar6 + dVar2) - local_190;
  }
  else {
    local_190 = -2147483648.0;
  }
  dStack_b8 = local_190;
  AActor::Pos(&local_110,dest);
  TVector3<double>::XY((TVector3<double> *)local_f8);
  TVector2<double>::operator+((TVector2<double> *)(local_f8 + 0x10),(TVector2<double> *)local_f8);
  TVector3<double>::TVector3(&local_d8,(Vector2 *)(local_f8 + 0x10),dStack_b8);
  TAngle<double>::TAngle(&local_118,0.0);
  flags = 4;
  if ((an.Degrees._6_1_ & 1) != 0) {
    flags = 3;
  }
  local_b9 = P_Teleport(victim,&local_d8,&local_118,flags);
  TAngle<double>::TAngle(&local_138,&(victim->Angles).Yaw);
  TAngle<double>::operator+(&local_130,&(dest->Angles).Yaw);
  TAngle<double>::TAngle(&local_140,&(source->Angles).Yaw);
  TAngle<double>::operator-(&local_128,&local_130);
  TAngle<double>::Normalized360(&local_120);
  TAngle<double>::operator=(&(victim->Angles).Yaw,&local_120);
  return (bool)(local_b9 & 1);
}

Assistant:

static bool DoGroupForOne (AActor *victim, AActor *source, AActor *dest, bool floorz, bool fog)
{
	DAngle an = dest->Angles.Yaw - source->Angles.Yaw;
	DVector2 off = victim->Pos() - source->Pos();
	DAngle offAngle = victim->Angles.Yaw - source->Angles.Yaw;
	DVector2 newp = { off.X * an.Cos() - off.Y * an.Sin(), off.X * an.Sin() + off.Y * an.Cos() };
	double z = floorz ? ONFLOORZ : dest->Z() + victim->Z() - source->Z();

	bool res =
		P_Teleport (victim, DVector3(dest->Pos().XY() + newp, z),
							0., fog ? (TELF_DESTFOG | TELF_SOURCEFOG) : TELF_KEEPORIENTATION);
	// P_Teleport only changes angle if fog is true
	victim->Angles.Yaw = (dest->Angles.Yaw + victim->Angles.Yaw - source->Angles.Yaw).Normalized360();

	return res;
}